

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetDeviceDisableMetricsExp(zet_device_handle_t hDevice)

{
  zet_pfnDeviceDisableMetricsExp_t pfnDisableMetricsExp;
  ze_result_t result;
  zet_device_handle_t hDevice_local;
  
  pfnDisableMetricsExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c818 != (code *)0x0) {
    pfnDisableMetricsExp._4_4_ = (*DAT_0011c818)(hDevice);
  }
  return pfnDisableMetricsExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetDeviceDisableMetricsExp(
        zet_device_handle_t hDevice                     ///< [in] handle of the device where metrics collection has to be disabled
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDisableMetricsExp = context.zetDdiTable.DeviceExp.pfnDisableMetricsExp;
        if( nullptr != pfnDisableMetricsExp )
        {
            result = pfnDisableMetricsExp( hDevice );
        }
        else
        {
            // generic implementation
        }

        return result;
    }